

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateHeader(FileGenerator *this,Printer *printer)

{
  bool bVar1;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar2;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar3;
  scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *psVar4;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *psVar5;
  FileDescriptor *pFVar6;
  char *__function;
  long lVar7;
  string filename_identifier;
  string local_90;
  string local_70;
  string local_50;
  
  FilenameIdentifier(&local_50,*(string **)this->file_);
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#ifndef PROTOBUF_$filename_identifier$__INCLUDED\n#define PROTOBUF_$filename_identifier$__INCLUDED\n\n#include <string>\n\n"
             ,(string *)0x16f45b,*(char **)this->file_,(string *)"filename_identifier");
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::SimpleItoa_abi_cxx11_((int)&local_90);
  google::protobuf::SimpleItoa_abi_cxx11_((int)&local_70);
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "#if GOOGLE_PROTOBUF_VERSION < $min_header_version$\n#error This file was generated by a newer version of protoc which is\n#error incompatible with your Protocol Buffer headers.  Please update\n#error your headers.\n#endif\n#if $protoc_version$ < GOOGLE_PROTOBUF_MIN_PROTOC_VERSION\n#error This file was generated by an older version of protoc which is\n#error incompatible with your Protocol Buffer headers.  Please\n#error regenerate this file with a newer version of protoc.\n#endif\n\n"
             ,(string *)"min_header_version",(char *)&local_90,(string *)"protoc_version");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  google::protobuf::io::Printer::Print((char *)printer);
  if (0 < *(int *)(this->file_ + 0x48)) {
    google::protobuf::io::Printer::Print((char *)printer);
  }
  google::protobuf::io::Printer::Print((char *)printer);
  if ((*(int *)(*(long *)(this->file_ + 0x88) + 0x50) != 3) &&
     (bVar1 = HasEnumDefinitions(this->file_), bVar1)) {
    google::protobuf::io::Printer::Print((char *)printer);
  }
  pFVar6 = this->file_;
  if (((0 < *(int *)(pFVar6 + 0x68)) && (*(int *)(*(long *)(pFVar6 + 0x88) + 0x50) != 3)) &&
     (*(char *)(*(long *)(pFVar6 + 0x88) + 0x56) == '\x01')) {
    google::protobuf::io::Printer::Print((char *)printer);
    pFVar6 = this->file_;
  }
  if ((*(int *)(*(long *)(pFVar6 + 0x88) + 0x50) != 3) && (0 < *(int *)(pFVar6 + 0x48))) {
    google::protobuf::io::Printer::Print((char *)printer);
    pFVar6 = this->file_;
  }
  if (0 < *(int *)(pFVar6 + 0x18)) {
    lVar7 = 0;
    do {
      StripProto(&local_90,(string *)**(undefined8 **)(*(long *)(pFVar6 + 0x20) + lVar7 * 8));
      google::protobuf::io::Printer::Print
                ((char *)printer,"#include \"$dependency$.pb.h\"\n",(string *)"dependency");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      lVar7 = lVar7 + 1;
      pFVar6 = this->file_;
    } while (lVar7 < *(int *)(pFVar6 + 0x18));
  }
  google::protobuf::io::Printer::Print((char *)printer);
  GenerateNamespaceOpeners(this,printer);
  GlobalAddDescriptorsName(&local_90,*(string **)this->file_);
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "\n// Internal implementation detail -- do not call these.\nvoid $dllexport_decl$ $adddescriptorsname$();\n"
             ,(string *)"adddescriptorsname",(char *)&local_90,(string *)"dllexport_decl");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  GlobalAssignDescriptorsName(&local_90,*(string **)this->file_);
  GlobalShutdownFileName(&local_70,*(string **)this->file_);
  google::protobuf::io::Printer::Print
            ((char *)printer,"void $assigndescriptorsname$();\nvoid $shutdownfilename$();\n\n",
             (string *)"assigndescriptorsname",(char *)&local_90,(string *)"shutdownfilename");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)(this->file_ + 0x48)) {
    lVar7 = 0;
    do {
      psVar2 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar7);
      if (psVar2->ptr_ == (MessageGenerator *)0x0) goto LAB_0013f605;
      MessageGenerator::GenerateForwardDeclaration(psVar2->ptr_,printer);
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(this->file_ + 0x48));
  }
  google::protobuf::io::Printer::Print((char *)printer);
  pFVar6 = this->file_;
  if (0 < *(int *)(pFVar6 + 0x48)) {
    lVar7 = 0;
    do {
      psVar2 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar7);
      if (psVar2->ptr_ == (MessageGenerator *)0x0) goto LAB_0013f605;
      MessageGenerator::GenerateEnumDefinitions(psVar2->ptr_,printer);
      lVar7 = lVar7 + 1;
      pFVar6 = this->file_;
    } while (lVar7 < *(int *)(pFVar6 + 0x48));
  }
  if (0 < *(int *)(pFVar6 + 0x58)) {
    lVar7 = 0;
    do {
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
               ::operator[](&this->enum_generators_,lVar7);
      if (psVar3->ptr_ == (EnumGenerator *)0x0) goto LAB_0013f61c;
      EnumGenerator::GenerateDefinition(psVar3->ptr_,printer);
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(this->file_ + 0x58));
  }
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Print((char *)printer);
  if (0 < *(int *)(this->file_ + 0x48)) {
    lVar7 = 0;
    do {
      if (lVar7 != 0) {
        google::protobuf::io::Printer::Print((char *)printer);
        google::protobuf::io::Printer::Print((char *)printer);
        google::protobuf::io::Printer::Print((char *)printer);
      }
      psVar2 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar7);
      if (psVar2->ptr_ == (MessageGenerator *)0x0) goto LAB_0013f605;
      MessageGenerator::GenerateClassDefinition(psVar2->ptr_,printer);
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(this->file_ + 0x48));
  }
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Print((char *)printer);
  pFVar6 = this->file_;
  if (((0 < *(int *)(pFVar6 + 0x68)) && (*(int *)(*(long *)(pFVar6 + 0x88) + 0x50) != 3)) &&
     (*(char *)(*(long *)(pFVar6 + 0x88) + 0x56) == '\x01')) {
    lVar7 = 0;
    do {
      if (lVar7 != 0) {
        google::protobuf::io::Printer::Print((char *)printer);
        google::protobuf::io::Printer::Print((char *)printer);
        google::protobuf::io::Printer::Print((char *)printer);
      }
      psVar4 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
               ::operator[](&this->service_generators_,lVar7);
      if (psVar4->ptr_ == (ServiceGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>::operator->() const [C = google::protobuf::compiler::cpp::ServiceGenerator]"
        ;
        goto LAB_0013f648;
      }
      ServiceGenerator::GenerateDeclarations(psVar4->ptr_,printer);
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(this->file_ + 0x68));
    google::protobuf::io::Printer::Print((char *)printer);
    google::protobuf::io::Printer::Print((char *)printer);
    google::protobuf::io::Printer::Print((char *)printer);
    pFVar6 = this->file_;
  }
  if (0 < *(int *)(pFVar6 + 0x78)) {
    lVar7 = 0;
    do {
      psVar5 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
               ::operator[](&this->extension_generators_,lVar7);
      if (psVar5->ptr_ == (ExtensionGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::operator->() const [C = google::protobuf::compiler::cpp::ExtensionGenerator]"
        ;
        goto LAB_0013f648;
      }
      ExtensionGenerator::GenerateDeclaration(psVar5->ptr_,printer);
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(this->file_ + 0x78));
  }
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Print((char *)printer);
  if (0 < *(int *)(this->file_ + 0x48)) {
    lVar7 = 0;
    do {
      if (lVar7 != 0) {
        google::protobuf::io::Printer::Print((char *)printer);
        google::protobuf::io::Printer::Print((char *)printer);
      }
      psVar2 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar7);
      if (psVar2->ptr_ == (MessageGenerator *)0x0) goto LAB_0013f605;
      MessageGenerator::GenerateInlineMethods(psVar2->ptr_,printer);
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(this->file_ + 0x48));
  }
  google::protobuf::io::Printer::Print((char *)printer);
  GenerateNamespaceClosers(this,printer);
  if (*(int *)(*(long *)(this->file_ + 0x88) + 0x50) != 3) {
    google::protobuf::io::Printer::Print((char *)printer);
    pFVar6 = this->file_;
    if (0 < *(int *)(pFVar6 + 0x48)) {
      lVar7 = 0;
      do {
        psVar2 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
                 ::operator[](&this->message_generators_,lVar7);
        if (psVar2->ptr_ == (MessageGenerator *)0x0) goto LAB_0013f605;
        MessageGenerator::GenerateGetEnumDescriptorSpecializations(psVar2->ptr_,printer);
        lVar7 = lVar7 + 1;
        pFVar6 = this->file_;
      } while (lVar7 < *(int *)(pFVar6 + 0x48));
    }
    if (0 < *(int *)(pFVar6 + 0x58)) {
      lVar7 = 0;
      do {
        psVar3 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
                 ::operator[](&this->enum_generators_,lVar7);
        if (psVar3->ptr_ == (EnumGenerator *)0x0) goto LAB_0013f61c;
        EnumGenerator::GenerateGetEnumDescriptorSpecializations(psVar3->ptr_,printer);
        lVar7 = lVar7 + 1;
      } while (lVar7 < *(int *)(this->file_ + 0x58));
    }
    google::protobuf::io::Printer::Print((char *)printer);
  }
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Print
            ((char *)printer,"#endif  // PROTOBUF_$filename_identifier$__INCLUDED\n",
             (string *)"filename_identifier");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
LAB_0013f605:
  __function = 
  "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cpp::MessageGenerator]"
  ;
  goto LAB_0013f648;
LAB_0013f61c:
  __function = 
  "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::operator->() const [C = google::protobuf::compiler::cpp::EnumGenerator]"
  ;
LAB_0013f648:
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/stubs/common.h"
                ,0x1e3,__function);
}

Assistant:

void FileGenerator::GenerateHeader(io::Printer* printer) {
  string filename_identifier = FilenameIdentifier(file_->name());

  // Generate top of header.
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n"
    "#ifndef PROTOBUF_$filename_identifier$__INCLUDED\n"
    "#define PROTOBUF_$filename_identifier$__INCLUDED\n"
    "\n"
    "#include <string>\n"
    "\n",
    "filename", file_->name(),
    "filename_identifier", filename_identifier);


  printer->Print(
    "#include <google/protobuf/stubs/common.h>\n"
    "\n");

  // Verify the protobuf library header version is compatible with the protoc
  // version before going any further.
  printer->Print(
    "#if GOOGLE_PROTOBUF_VERSION < $min_header_version$\n"
    "#error This file was generated by a newer version of protoc which is\n"
    "#error incompatible with your Protocol Buffer headers.  Please update\n"
    "#error your headers.\n"
    "#endif\n"
    "#if $protoc_version$ < GOOGLE_PROTOBUF_MIN_PROTOC_VERSION\n"
    "#error This file was generated by an older version of protoc which is\n"
    "#error incompatible with your Protocol Buffer headers.  Please\n"
    "#error regenerate this file with a newer version of protoc.\n"
    "#endif\n"
    "\n",
    "min_header_version",
      SimpleItoa(protobuf::internal::kMinHeaderVersionForProtoc),
    "protoc_version", SimpleItoa(GOOGLE_PROTOBUF_VERSION));

  // OK, it's now safe to #include other files.
  printer->Print(
    "#include <google/protobuf/generated_message_util.h>\n");
  if (file_->message_type_count() > 0) {
    if (HasDescriptorMethods(file_)) {
      printer->Print(
        "#include <google/protobuf/message.h>\n");
    } else {
      printer->Print(
        "#include <google/protobuf/message_lite.h>\n");
    }
  }
  printer->Print(
    "#include <google/protobuf/repeated_field.h>\n"
    "#include <google/protobuf/extension_set.h>\n");

  if (HasDescriptorMethods(file_) && HasEnumDefinitions(file_)) {
    printer->Print(
      "#include <google/protobuf/generated_enum_reflection.h>\n");
  }

  if (HasGenericServices(file_)) {
    printer->Print(
      "#include <google/protobuf/service.h>\n");
  }

  if (HasUnknownFields(file_) && file_->message_type_count() > 0) {
    printer->Print(
      "#include <google/protobuf/unknown_field_set.h>\n");
  }


  for (int i = 0; i < file_->dependency_count(); i++) {
    printer->Print(
      "#include \"$dependency$.pb.h\"\n",
      "dependency", StripProto(file_->dependency(i)->name()));
  }


  printer->Print(
    "// @@protoc_insertion_point(includes)\n");


  // Open namespace.
  GenerateNamespaceOpeners(printer);

  // Forward-declare the AddDescriptors, AssignDescriptors, and ShutdownFile
  // functions, so that we can declare them to be friends of each class.
  printer->Print(
    "\n"
    "// Internal implementation detail -- do not call these.\n"
    "void $dllexport_decl$ $adddescriptorsname$();\n",
    "adddescriptorsname", GlobalAddDescriptorsName(file_->name()),
    "dllexport_decl", options_.dllexport_decl);

  printer->Print(
    // Note that we don't put dllexport_decl on these because they are only
    // called by the .pb.cc file in which they are defined.
    "void $assigndescriptorsname$();\n"
    "void $shutdownfilename$();\n"
    "\n",
    "assigndescriptorsname", GlobalAssignDescriptorsName(file_->name()),
    "shutdownfilename", GlobalShutdownFileName(file_->name()));

  // Generate forward declarations of classes.
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateForwardDeclaration(printer);
  }

  printer->Print("\n");

  // Generate enum definitions.
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateEnumDefinitions(printer);
  }
  for (int i = 0; i < file_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateDefinition(printer);
  }

  printer->Print(kThickSeparator);
  printer->Print("\n");

  // Generate class definitions.
  for (int i = 0; i < file_->message_type_count(); i++) {
    if (i > 0) {
      printer->Print("\n");
      printer->Print(kThinSeparator);
      printer->Print("\n");
    }
    message_generators_[i]->GenerateClassDefinition(printer);
  }

  printer->Print("\n");
  printer->Print(kThickSeparator);
  printer->Print("\n");

  if (HasGenericServices(file_)) {
    // Generate service definitions.
    for (int i = 0; i < file_->service_count(); i++) {
      if (i > 0) {
        printer->Print("\n");
        printer->Print(kThinSeparator);
        printer->Print("\n");
      }
      service_generators_[i]->GenerateDeclarations(printer);
    }

    printer->Print("\n");
    printer->Print(kThickSeparator);
    printer->Print("\n");
  }

  // Declare extension identifiers.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateDeclaration(printer);
  }

  printer->Print("\n");
  printer->Print(kThickSeparator);
  printer->Print("\n");

  // Generate class inline methods.
  for (int i = 0; i < file_->message_type_count(); i++) {
    if (i > 0) {
      printer->Print(kThinSeparator);
      printer->Print("\n");
    }
    message_generators_[i]->GenerateInlineMethods(printer);
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(namespace_scope)\n");

  // Close up namespace.
  GenerateNamespaceClosers(printer);

  // Emit GetEnumDescriptor specializations into google::protobuf namespace:
  if (HasDescriptorMethods(file_)) {
    // The SWIG conditional is to avoid a null-pointer dereference
    // (bug 1984964) in swig-1.3.21 resulting from the following syntax:
    //   namespace X { void Y<Z::W>(); }
    // which appears in GetEnumDescriptor() specializations.
    printer->Print(
        "\n"
        "#ifndef SWIG\n"
        "namespace google {\nnamespace protobuf {\n"
        "\n");
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
    }
    for (int i = 0; i < file_->enum_type_count(); i++) {
      enum_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
    }
    printer->Print(
        "\n"
        "}  // namespace google\n}  // namespace protobuf\n"
        "#endif  // SWIG\n");
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(global_scope)\n"
    "\n");

  printer->Print(
    "#endif  // PROTOBUF_$filename_identifier$__INCLUDED\n",
    "filename_identifier", filename_identifier);
}